

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

bool __thiscall
MarkdownHighlighter::isPosInACodeSpan(MarkdownHighlighter *this,int blockNumber,int position)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator __last;
  const_iterator local_50;
  QList<MarkdownHighlighter::InlineRange> local_48;
  undefined1 local_30 [8];
  QVector<InlineRange> rangeList;
  int position_local;
  int blockNumber_local;
  MarkdownHighlighter *this_local;
  
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (InlineRange *)0x0;
  local_48.d.size = 0;
  rangeList.d.size._0_4_ = position;
  rangeList.d.size._4_4_ = blockNumber;
  QList<MarkdownHighlighter::InlineRange>::QList(&local_48);
  QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::value
            ((QList<MarkdownHighlighter::InlineRange> *)local_30,&this->_ranges,
             (int *)((long)&rangeList.d.size + 4),&local_48);
  QList<MarkdownHighlighter::InlineRange>::~QList(&local_48);
  cVar2 = QList<MarkdownHighlighter::InlineRange>::cbegin
                    ((QList<MarkdownHighlighter::InlineRange> *)local_30);
  __last = QList<MarkdownHighlighter::InlineRange>::cend
                     ((QList<MarkdownHighlighter::InlineRange> *)local_30);
  local_50 = std::
             find_if<QList<MarkdownHighlighter::InlineRange>::const_iterator,MarkdownHighlighter::isPosInACodeSpan(int,int)const::__0>
                       (cVar2,__last,rangeList.d.size._0_4_);
  cVar2 = QList<MarkdownHighlighter::InlineRange>::cend
                    ((QList<MarkdownHighlighter::InlineRange> *)local_30);
  bVar1 = QList<MarkdownHighlighter::InlineRange>::const_iterator::operator!=(&local_50,cVar2);
  QList<MarkdownHighlighter::InlineRange>::~QList
            ((QList<MarkdownHighlighter::InlineRange> *)local_30);
  return bVar1;
}

Assistant:

bool MarkdownHighlighter::isPosInACodeSpan(int blockNumber, int position) const
{
    const QVector<InlineRange> rangeList = _ranges.value(blockNumber);
    return std::find_if(rangeList.cbegin(), rangeList.cend(),
                                     [position](const InlineRange& range){
        if (position > range.begin && position < range.end && range.type == RangeType::CodeSpan)
            return true;
        return false;
    }) != rangeList.cend();
}